

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

_Bool do_vfp_2op_sp(DisasContext_conflict1 *s,VFPGen2OpSPFn_conflict *fn,int vd,int vm)

{
  TCGContext_conflict1 *tcg_ctx;
  uint uVar1;
  _Bool _Var2;
  TCGv_i32 var;
  TCGv_i32 var_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint reg;
  bool bVar6;
  
  uVar3 = s->isar->mvfr0;
  if ((uVar3 & 0xf0) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar5 = s->vec_len;
    if (((uVar3 & 0xf000000) != 0) || ((iVar5 == 0 && (s->vec_stride == 0)))) {
      _Var2 = vfp_access_check(s);
      if (!_Var2) {
        return true;
      }
      if (iVar5 < 1) {
        uVar3 = 0;
        uVar1 = 0;
      }
      else if ((vd & 0x18U) == 0) {
        uVar3 = 0;
        iVar5 = 0;
        uVar1 = 0;
      }
      else {
        uVar3 = s->vec_stride + 1;
        uVar1 = vm & 0x18U;
        if ((vm & 0x18U) != 0) {
          uVar1 = uVar3;
        }
      }
      var = tcg_temp_new_i32(tcg_ctx);
      var_00 = tcg_temp_new_i32(tcg_ctx);
      neon_load_reg32(tcg_ctx,var,vm);
      iVar4 = iVar5;
      reg = vd;
      while( true ) {
        (*fn)(tcg_ctx,var_00,var);
        neon_store_reg32(tcg_ctx,var_00,reg);
        bVar6 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar6) break;
        if (uVar1 == 0) goto LAB_005f77f5;
        reg = reg & 0xfffffff8 | uVar3 + reg & 7;
        vm = vm & 0xfffffff8U | vm + uVar1 & 7;
        neon_load_reg32(tcg_ctx,var,vm);
      }
      goto LAB_005f77fa;
    }
  }
  return false;
LAB_005f77f5:
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    vd = vd & 0xfffffff8U | uVar3 + vd & 7;
    neon_store_reg32(tcg_ctx,var_00,vd);
  }
LAB_005f77fa:
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_00 + (long)tcg_ctx));
  return true;
}

Assistant:

static bool do_vfp_2op_sp(DisasContext *s, VFPGen2OpSPFn *fn, int vd, int vm)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i32 f0, fd;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_sreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = s->vec_stride + 1;

            if (vfp_sreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i32(tcg_ctx);
    fd = tcg_temp_new_i32(tcg_ctx);

    neon_load_reg32(tcg_ctx, f0, vm);

    for (;;) {
        fn(tcg_ctx, fd, f0);
        neon_store_reg32(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        if (delta_m == 0) {
            /* single source one-many */
            while (veclen--) {
                vd = vfp_advance_sreg(vd, delta_d);
                neon_store_reg32(tcg_ctx, fd, vd);
            }
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_sreg(vd, delta_d);
        vm = vfp_advance_sreg(vm, delta_m);
        neon_load_reg32(tcg_ctx, f0, vm);
    }

    tcg_temp_free_i32(tcg_ctx, f0);
    tcg_temp_free_i32(tcg_ctx, fd);

    return true;
}